

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O2

bool AllIdentical<aiVectorKey>(aiVectorKey *in,uint num,ai_real epsilon)

{
  bool bVar1;
  long lVar2;
  aiVector3t<float> *this;
  bool bVar3;
  
  bVar3 = true;
  if (1 < num) {
    lVar2 = (ulong)(num - 1) + 1;
    if (epsilon == 0.0) {
      this = &in[1].mValue;
      do {
        lVar2 = lVar2 + -1;
        bVar3 = lVar2 == 0;
        if (bVar3) {
          return bVar3;
        }
        bVar1 = aiVector3t<float>::operator!=(this,this + -2);
        this = this + 2;
      } while (!bVar1);
    }
    else {
      do {
        lVar2 = lVar2 + -1;
        bVar3 = lVar2 == 0;
        if (bVar3) {
          return bVar3;
        }
        bVar1 = EpsilonCompare<aiVectorKey>(in,in + 1,epsilon);
        in = in + 1;
      } while (bVar1);
    }
  }
  return bVar3;
}

Assistant:

inline
bool AllIdentical(T* in, unsigned int num, ai_real epsilon) {
    if (num <= 1) {
        return true;
    }

    if (fabs(epsilon) > 0.f) {
        for (unsigned int i = 0; i < num-1;++i) {
            if (!EpsilonCompare(in[i],in[i+1],epsilon)) {
                return false;
            }
        }
    } else {
        for (unsigned int i = 0; i < num-1;++i) {
            if (in[i] != in[i+1]) {
                return false;
            }
        }
    }
    return true;
}